

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Array.cc
# Opt level: O1

void __thiscall qpdf::Array::push_back(Array *this,QPDFObjectHandle *item)

{
  _Head_base<0UL,_QPDF_Array::Sparse_*,_false> _Var1;
  QPDF_Array *pQVar2;
  mapped_type *pmVar3;
  int local_1c;
  
  pQVar2 = array(this);
  checkOwnership(this,item);
  _Var1._M_head_impl =
       (pQVar2->sp)._M_t.
       super___uniq_ptr_impl<QPDF_Array::Sparse,_std::default_delete<QPDF_Array::Sparse>_>._M_t.
       super__Tuple_impl<0UL,_QPDF_Array::Sparse_*,_std::default_delete<QPDF_Array::Sparse>_>.
       super__Head_base<0UL,_QPDF_Array::Sparse_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (Sparse *)0x0) {
    local_1c = (_Var1._M_head_impl)->size;
    (_Var1._M_head_impl)->size = local_1c + 1;
    pmVar3 = std::
             map<int,_QPDFObjectHandle,_std::less<int>,_std::allocator<std::pair<const_int,_QPDFObjectHandle>_>_>
             ::operator[](&(_Var1._M_head_impl)->elements,&local_1c);
    (pmVar3->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (item->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar3->super_BaseHandle).obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(item->super_BaseHandle).obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
  emplace_back<QPDFObjectHandle_const&>
            ((vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)&pQVar2->elements,item);
  return;
}

Assistant:

void
Array::push_back(QPDFObjectHandle const& item)
{
    auto a = array();
    checkOwnership(item);
    if (a->sp) {
        a->sp->elements[(a->sp->size)++] = item;
    } else {
        a->elements.emplace_back(item);
    }
}